

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::yml::anon_unknown_0::_resolve_tags(Tree *t,size_t node)

{
  NodeType_e NVar1;
  size_t i;
  NodeData *pNVar2;
  csubstr *pcVar3;
  size_t in_R8;
  csubstr cVar4;
  csubstr tag;
  
  for (i = Tree::first_child(t,node); i != 0xffffffffffffffff; i = Tree::next_sibling(t,i)) {
    pNVar2 = Tree::_p(t,i);
    if (((pNVar2->m_type).type & KEY) != NOTYPE) {
      pNVar2 = Tree::_p(t,i);
      if ((~(int)(pNVar2->m_type).type & 0x402U) == 0) {
        pcVar3 = Tree::key_tag(t,i);
        cVar4.len = i;
        cVar4.str = (char *)pcVar3->len;
        cVar4 = _transform_tag((anon_unknown_0 *)t,(Tree *)pcVar3->str,cVar4,in_R8);
        Tree::set_key_tag(t,i,cVar4);
      }
    }
    pNVar2 = Tree::_p(t,i);
    if (((pNVar2->m_type).type & VAL) != NOTYPE) {
      pNVar2 = Tree::_p(t,i);
      NVar1 = (pNVar2->m_type).type;
      if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 0xb & 1) != 0) {
        pcVar3 = Tree::val_tag(t,i);
        tag.len = i;
        tag.str = (char *)pcVar3->len;
        cVar4 = _transform_tag((anon_unknown_0 *)t,(Tree *)pcVar3->str,tag,in_R8);
        Tree::set_val_tag(t,i,cVar4);
      }
    }
    _resolve_tags(t,i);
  }
  return;
}

Assistant:

void _resolve_tags(Tree *t, size_t node)
{
    for(size_t child = t->first_child(node); child != NONE; child = t->next_sibling(child))
    {
        if(t->has_key(child) && t->has_key_tag(child))
            t->set_key_tag(child, _transform_tag(t, t->key_tag(child), child));
        if(t->has_val(child) && t->has_val_tag(child))
            t->set_val_tag(child, _transform_tag(t, t->val_tag(child), child));
        _resolve_tags(t, child);
    }
}